

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::BeginCustomSection
          (BinaryReaderObjdump *this,Index section_index,Offset size,string_view section_name)

{
  size_type sVar1;
  const_pointer pvVar2;
  Offset size_local;
  Index section_index_local;
  BinaryReaderObjdump *this_local;
  string_view section_name_local;
  
  section_name_local._M_len = (size_t)section_name._M_str;
  this_local = (BinaryReaderObjdump *)section_name._M_len;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  PrintDetails(this," - name: \"%.*s\"\n",sVar1 & 0xffffffff,pvVar2);
  if (((this->super_BinaryReaderObjdumpBase).options_)->mode == Headers) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    printf("\"%.*s\"\n",sVar1 & 0xffffffff,pvVar2);
  }
  Result::Result((Result *)((long)&section_name_local._M_str + 4),Ok);
  return (Result)section_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginCustomSection(Index section_index,
                                               Offset size,
                                               std::string_view section_name) {
  PrintDetails(" - name: \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(section_name));
  if (options_->mode == ObjdumpMode::Headers) {
    printf("\"" PRIstringview "\"\n",
           WABT_PRINTF_STRING_VIEW_ARG(section_name));
  }
  return Result::Ok;
}